

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
print_fileinfo::print_fileinfo(print_fileinfo *this,string *filesystemname,string *romname)

{
  (this->super_action)._vptr_action = (_func_int **)&PTR__print_fileinfo_00143850;
  std::__cxx11::string::string((string *)&this->_fsname,(string *)filesystemname);
  std::__cxx11::string::string((string *)&this->_romname,(string *)romname);
  return;
}

Assistant:

print_fileinfo(const std::string& filesystemname, const std::string&romname)
        : _fsname(filesystemname), _romname(romname)
    {
    }